

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx512::OrientedDiscMiMBIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  Geometry *pGVar4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  float fVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  Scene *pSVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  int local_134;
  Scene *local_130;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar43 [64];
  
  pSVar25 = context->scene;
  uVar15 = (ulong)(Disc->primIDs).field_0.i[0];
  local_130 = pSVar25;
  pGVar4 = (pSVar25->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar4->time_range).lower;
  fVar9 = pGVar4->fnumTimeSegments *
          (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar1) / ((pGVar4->time_range).upper - fVar1)
          );
  auVar40 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
  auVar40 = vminss_avx(auVar40,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar40 = vmaxss_avx(ZEXT816(0) << 0x20,auVar40);
  fVar9 = fVar9 - auVar40._0_4_;
  iVar18 = (int)auVar40._0_4_;
  lVar5 = *(long *)&pGVar4[2].numPrimitives;
  lVar24 = (long)iVar18 * 0x38;
  lVar6 = *(long *)(lVar5 + lVar24);
  lVar23 = *(long *)(lVar5 + 0x10 + lVar24);
  auVar40 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar15);
  uVar20 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar30 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar20);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar29 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar21);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar31 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar22);
  auVar33 = vunpcklps_avx(auVar40,auVar29);
  auVar38 = vunpckhps_avx(auVar40,auVar29);
  auVar40 = vunpcklps_avx(auVar30,auVar31);
  auVar39 = vunpckhps_avx(auVar30,auVar31);
  auVar36 = vunpcklps_avx(auVar33,auVar40);
  auVar33 = vunpckhps_avx(auVar33,auVar40);
  auVar37 = vunpcklps_avx(auVar38,auVar39);
  p_Var7 = pGVar4[2].intersectionFilterN;
  lVar6 = *(long *)(p_Var7 + lVar24);
  lVar23 = *(long *)(p_Var7 + lVar24 + 0x10);
  auVar40 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar15);
  auVar30 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar20);
  auVar29 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar21);
  auVar31 = *(undefined1 (*) [16])(lVar6 + lVar23 * uVar22);
  auVar35 = vunpcklps_avx(auVar40,auVar29);
  auVar40 = vunpckhps_avx(auVar40,auVar29);
  auVar29 = vunpcklps_avx(auVar30,auVar31);
  auVar30 = vunpckhps_avx(auVar30,auVar31);
  auVar45 = vunpcklps_avx(auVar40,auVar30);
  auVar46 = vunpcklps_avx(auVar35,auVar29);
  auVar35 = vunpckhps_avx(auVar35,auVar29);
  lVar23 = (long)(iVar18 + 1) * 0x38;
  lVar6 = *(long *)(lVar5 + lVar23);
  lVar5 = *(long *)(lVar5 + 0x10 + lVar23);
  auVar40 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar15);
  auVar30 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar20);
  auVar29 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar21);
  auVar31 = *(undefined1 (*) [16])(lVar6 + lVar5 * uVar22);
  auVar34 = vunpcklps_avx(auVar40,auVar29);
  auVar41 = vunpckhps_avx(auVar40,auVar29);
  auVar40 = vunpcklps_avx(auVar30,auVar31);
  auVar42 = vunpckhps_avx(auVar30,auVar31);
  auVar49 = vunpcklps_avx(auVar34,auVar40);
  auVar34 = vunpckhps_avx(auVar34,auVar40);
  auVar27 = vunpcklps_avx512vl(auVar41,auVar42);
  lVar5 = *(long *)(p_Var7 + lVar23);
  lVar6 = *(long *)(p_Var7 + lVar23 + 0x10);
  auVar40 = *(undefined1 (*) [16])(lVar5 + uVar15 * lVar6);
  auVar30 = *(undefined1 (*) [16])(lVar5 + uVar20 * lVar6);
  auVar29 = *(undefined1 (*) [16])(lVar5 + uVar21 * lVar6);
  auVar31 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar22);
  auVar28 = vunpcklps_avx512vl(auVar40,auVar29);
  auVar40 = vunpckhps_avx(auVar40,auVar29);
  auVar29 = vunpcklps_avx512vl(auVar30,auVar31);
  auVar30 = vunpckhps_avx512vl(auVar30,auVar31);
  auVar31 = vunpcklps_avx512vl(auVar40,auVar30);
  auVar32 = vunpcklps_avx512vl(auVar28,auVar29);
  auVar28 = vunpckhps_avx512vl(auVar28,auVar29);
  auVar47._4_4_ = fVar9;
  auVar47._0_4_ = fVar9;
  auVar47._8_4_ = fVar9;
  auVar47._12_4_ = fVar9;
  fVar1 = 1.0 - fVar9;
  auVar48._4_4_ = fVar1;
  auVar48._0_4_ = fVar1;
  auVar48._8_4_ = fVar1;
  auVar48._12_4_ = fVar1;
  auVar40._0_4_ = fVar9 * auVar49._0_4_;
  auVar40._4_4_ = fVar9 * auVar49._4_4_;
  auVar40._8_4_ = fVar9 * auVar49._8_4_;
  auVar40._12_4_ = fVar9 * auVar49._12_4_;
  auVar30._0_4_ = fVar9 * auVar34._0_4_;
  auVar30._4_4_ = fVar9 * auVar34._4_4_;
  auVar30._8_4_ = fVar9 * auVar34._8_4_;
  auVar30._12_4_ = fVar9 * auVar34._12_4_;
  auVar29 = vmulps_avx512vl(auVar47,auVar27);
  auVar40 = vfmadd231ps_fma(auVar40,auVar48,auVar36);
  auVar30 = vfmadd231ps_fma(auVar30,auVar48,auVar33);
  auVar29 = vfmadd231ps_fma(auVar29,auVar48,auVar37);
  auVar33 = vmulps_avx512vl(auVar47,auVar32);
  auVar34 = vmulps_avx512vl(auVar47,auVar28);
  auVar31 = vmulps_avx512vl(auVar47,auVar31);
  local_88 = vfmadd231ps_fma(auVar33,auVar48,auVar46);
  local_78 = vfmadd231ps_fma(auVar34,auVar48,auVar35);
  auVar33 = vpbroadcastd_avx512vl();
  uVar12 = vpcmpgtd_avx512vl(auVar33,_DAT_01f4ad30);
  local_68 = vfmadd231ps_fma(auVar31,auVar48,auVar45);
  local_48 = vpbroadcastd_avx512vl();
  uVar2 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  auVar45._4_4_ = uVar2;
  auVar45._0_4_ = uVar2;
  auVar45._8_4_ = uVar2;
  auVar45._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  auVar46._4_4_ = uVar2;
  auVar46._0_4_ = uVar2;
  auVar46._8_4_ = uVar2;
  auVar46._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  auVar49._4_4_ = uVar2;
  auVar49._0_4_ = uVar2;
  auVar49._8_4_ = uVar2;
  auVar49._12_4_ = uVar2;
  auVar31 = vmulps_avx512vl(local_68,auVar49);
  auVar31 = vfmadd231ps_avx512vl(auVar31,auVar46,local_78);
  auVar31 = vfmadd231ps_avx512vl(auVar31,auVar45,local_88);
  uVar15 = vcmpps_avx512vl(auVar31,ZEXT816(0) << 0x20,0);
  fVar1 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar36._4_4_ = fVar1;
  auVar36._0_4_ = fVar1;
  auVar36._8_4_ = fVar1;
  auVar36._12_4_ = fVar1;
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
  auVar33 = vsubps_avx512vl(auVar40,auVar36);
  auVar36 = vsubps_avx512vl(auVar30,auVar35);
  auVar37 = vsubps_avx512vl(auVar29,auVar34);
  auVar37 = vmulps_avx512vl(local_68,auVar37);
  auVar36 = vfmadd231ps_avx512vl(auVar37,local_78,auVar36);
  auVar33 = vfmadd231ps_avx512vl(auVar36,local_88,auVar33);
  auVar31 = vdivps_avx512vl(auVar33,auVar31);
  bVar8 = (bool)((byte)uVar15 & 1);
  local_98._0_4_ = (uint)bVar8 * auVar33._0_4_ | (uint)!bVar8 * auVar31._0_4_;
  bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
  local_98._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar31._4_4_;
  bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
  local_98._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar31._8_4_;
  bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
  local_98._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar31._12_4_;
  auVar50 = ZEXT1664(local_98);
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar31._4_4_ = uVar2;
  auVar31._0_4_ = uVar2;
  auVar31._8_4_ = uVar2;
  auVar31._12_4_ = uVar2;
  uVar10 = vcmpps_avx512vl(local_98,auVar31,0xd);
  fVar3 = (ray->super_RayK<1>).tfar;
  auVar33._4_4_ = fVar3;
  auVar33._0_4_ = fVar3;
  auVar33._8_4_ = fVar3;
  auVar33._12_4_ = fVar3;
  uVar11 = vcmpps_avx512vl(local_98,auVar33,2);
  bVar14 = (byte)uVar10 & (byte)uVar11 & ~(byte)uVar15 & (byte)uVar12 & 0xf;
  if (bVar14 != 0) {
    auVar31 = vunpckhps_avx(auVar38,auVar39);
    auVar38 = vunpckhps_avx(auVar41,auVar42);
    auVar39._0_4_ = fVar9 * auVar38._0_4_;
    auVar39._4_4_ = fVar9 * auVar38._4_4_;
    auVar39._8_4_ = fVar9 * auVar38._8_4_;
    auVar39._12_4_ = fVar9 * auVar38._12_4_;
    auVar31 = vfmadd231ps_fma(auVar39,auVar48,auVar31);
    auVar38 = vmulps_avx512vl(auVar45,local_98);
    auVar39 = vmulps_avx512vl(auVar46,local_98);
    auVar33 = vmulps_avx512vl(auVar49,local_98);
    auVar41._0_4_ = fVar1 + auVar38._0_4_;
    auVar41._4_4_ = fVar1 + auVar38._4_4_;
    auVar41._8_4_ = fVar1 + auVar38._8_4_;
    auVar41._12_4_ = fVar1 + auVar38._12_4_;
    auVar38 = vaddps_avx512vl(auVar35,auVar39);
    auVar39 = vaddps_avx512vl(auVar34,auVar33);
    auVar40 = vsubps_avx(auVar41,auVar40);
    auVar30 = vsubps_avx(auVar38,auVar30);
    auVar29 = vsubps_avx(auVar39,auVar29);
    auVar38._0_4_ = auVar29._0_4_ * auVar29._0_4_;
    auVar38._4_4_ = auVar29._4_4_ * auVar29._4_4_;
    auVar38._8_4_ = auVar29._8_4_ * auVar29._8_4_;
    auVar38._12_4_ = auVar29._12_4_ * auVar29._12_4_;
    auVar30 = vfmadd231ps_fma(auVar38,auVar30,auVar30);
    auVar40 = vfmadd231ps_fma(auVar30,auVar40,auVar40);
    auVar29._0_4_ = auVar31._0_4_ * auVar31._0_4_;
    auVar29._4_4_ = auVar31._4_4_ * auVar31._4_4_;
    auVar29._8_4_ = auVar31._8_4_ * auVar31._8_4_;
    auVar29._12_4_ = auVar31._12_4_ * auVar31._12_4_;
    uVar10 = vcmpps_avx512vl(auVar40,auVar29,1);
    bVar14 = bVar14 & (byte)uVar10;
    if (bVar14 != 0) {
      auVar35._0_4_ = (ray->super_RayK<1>).tfar;
      auVar35._4_4_ = (ray->super_RayK<1>).mask;
      auVar35._8_4_ = (ray->super_RayK<1>).id;
      auVar35._12_4_ = (ray->super_RayK<1>).flags;
      auVar44 = ZEXT1664(auVar35);
      uVar16 = vextractps_avx(auVar35,1);
      local_b8 = ZEXT432(0) << 0x20;
      auVar42._8_4_ = 0x7f800000;
      auVar42._0_8_ = 0x7f8000007f800000;
      auVar42._12_4_ = 0x7f800000;
      auVar43 = ZEXT1664(auVar42);
      auVar40 = vblendmps_avx512vl(auVar42,local_98);
      local_58._4_4_ = (uint)(bVar14 >> 1 & 1) * auVar40._4_4_;
      local_58._0_4_ = (uint)(bVar14 & 1) * auVar40._0_4_;
      local_58._8_4_ = (uint)(bVar14 >> 2 & 1) * auVar40._8_4_;
      local_58._12_4_ = (uint)(bVar14 >> 3) * auVar40._12_4_;
      auVar40 = vshufps_avx(local_58,local_58,0xb1);
      auVar40 = vminps_avx(auVar40,local_58);
      auVar30 = vshufpd_avx(auVar40,auVar40,1);
      auVar40 = vminps_avx(auVar30,auVar40);
      uVar10 = vcmpps_avx512vl(local_58,auVar40,0);
      bVar17 = (byte)uVar10 & bVar14;
      bVar13 = bVar14;
      if (bVar17 != 0) {
        bVar13 = bVar17;
      }
      uVar19 = 0;
      for (uVar26 = (uint)bVar13; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
        uVar19 = uVar19 + 1;
      }
      do {
        uVar26 = uVar19 & 0xff;
        h.geomID = *(uint *)(local_48 + (ulong)uVar26 * 4);
        pGVar4 = (pSVar25->geometries).items[h.geomID].ptr;
        if ((pGVar4->mask & uVar16) == 0) {
          bVar14 = ~(byte)(1 << (uVar19 & 0x1f)) & bVar14;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar15 = (ulong)(uVar26 << 2);
            fVar1 = *(float *)(local_b8 + uVar15);
            fVar3 = *(float *)(local_b8 + uVar15 + 0x10);
            (ray->super_RayK<1>).tfar = *(float *)(local_98 + uVar15);
            (ray->Ng).field_0.field_0.x = *(float *)(local_88 + uVar15);
            (ray->Ng).field_0.field_0.y = *(float *)(local_78 + uVar15);
            (ray->Ng).field_0.field_0.z = *(float *)(local_68 + uVar15);
            ray->u = fVar1;
            ray->v = fVar3;
            ray->primID = *(uint *)((long)&(Disc->primIDs).field_0 + uVar15);
            ray->geomID = h.geomID;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_58 = auVar44._0_16_;
          auVar40 = auVar50._0_16_;
          uVar15 = (ulong)(uVar26 * 4);
          h.Ng.field_0.field_0.x = *(float *)(local_88 + uVar15);
          h.Ng.field_0.field_0.y = *(float *)(local_78 + uVar15);
          h.Ng.field_0.field_0.z = *(float *)(local_68 + uVar15);
          h.u = *(float *)(local_b8 + uVar15);
          h.v = *(float *)(local_b8 + uVar15 + 0x10);
          h.primID = *(uint *)((long)&(Disc->primIDs).field_0 + uVar15);
          h.instID[0] = context->user->instID[0];
          h.instPrimID[0] = context->user->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_98 + uVar15);
          local_134 = -1;
          args.valid = &local_134;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.ray = (RTCRayN *)ray;
          args.hit = (RTCHitN *)&h;
          args.N = 1;
          if ((pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar4->intersectionFilterN)(&args), *args.valid != 0)) {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                  RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)) &&
                ((*p_Var7)(&args), *args.valid == 0)))) goto LAB_01871afc;
            *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
            *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
            *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
            *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
            local_58 = ZEXT416(*(uint *)(args.hit + 0x10));
            *(uint *)(args.ray + 0x40) = *(uint *)(args.hit + 0x10);
            *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
            *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
            *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
            *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
          }
          else {
LAB_01871afc:
            (ray->super_RayK<1>).tfar = local_58._0_4_;
          }
          auVar50 = ZEXT1664(auVar40);
          auVar43 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar34._0_4_ = (ray->super_RayK<1>).tfar;
          auVar34._4_4_ = (ray->super_RayK<1>).mask;
          auVar34._8_4_ = (ray->super_RayK<1>).id;
          auVar34._12_4_ = (ray->super_RayK<1>).flags;
          auVar44 = ZEXT1664(auVar34);
          fVar1 = (ray->super_RayK<1>).tfar;
          auVar37._4_4_ = fVar1;
          auVar37._0_4_ = fVar1;
          auVar37._8_4_ = fVar1;
          auVar37._12_4_ = fVar1;
          uVar10 = vcmpps_avx512vl(auVar40,auVar37,2);
          bVar14 = ~(byte)(1 << (uVar19 & 0x1f)) & bVar14 & (byte)uVar10;
          uVar16 = vextractps_avx(auVar34,1);
          pSVar25 = local_130;
        }
        if (bVar14 == 0) {
          return;
        }
        auVar40 = vblendmps_avx512vl(auVar43._0_16_,auVar50._0_16_);
        auVar27._0_4_ =
             (uint)(bVar14 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar14 & 1) * local_58._0_4_;
        bVar8 = (bool)(bVar14 >> 1 & 1);
        auVar27._4_4_ = (uint)bVar8 * auVar40._4_4_ | (uint)!bVar8 * local_58._4_4_;
        bVar8 = (bool)(bVar14 >> 2 & 1);
        auVar27._8_4_ = (uint)bVar8 * auVar40._8_4_ | (uint)!bVar8 * local_58._8_4_;
        auVar27._12_4_ =
             (uint)(bVar14 >> 3) * auVar40._12_4_ | (uint)!(bool)(bVar14 >> 3) * local_58._12_4_;
        auVar40 = vshufps_avx(auVar27,auVar27,0xb1);
        auVar40 = vminps_avx(auVar40,auVar27);
        auVar30 = vshufpd_avx(auVar40,auVar40,1);
        auVar40 = vminps_avx(auVar30,auVar40);
        uVar10 = vcmpps_avx512vl(auVar27,auVar40,0);
        bVar17 = (byte)uVar10 & bVar14;
        bVar13 = bVar14;
        if (bVar17 != 0) {
          bVar13 = bVar17;
        }
        uVar19 = 0;
        for (uVar26 = (uint)bVar13; local_58 = auVar27, (uVar26 & 1) == 0;
            uVar26 = uVar26 >> 1 | 0x80000000) {
          uVar19 = uVar19 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }